

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

string * utilPresolveRuleTypeToString_abi_cxx11_(string *__return_storage_ptr__,HighsInt rule_type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(rule_type) {
  case 0:
    pcVar2 = "Empty row";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Singleton row";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Redundant row";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Empty column";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Fixed column";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Dominated col";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Forcing row";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Forcing col";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Free col substitution";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Doubleton equation";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Dependent equations";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Dependent free columns";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Aggregator";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Parallel rows and columns";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "????";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string utilPresolveRuleTypeToString(const HighsInt rule_type) {
  if (rule_type == kPresolveRuleEmptyRow) {
    return "Empty row";
  } else if (rule_type == kPresolveRuleSingletonRow) {
    return "Singleton row";
  } else if (rule_type == kPresolveRuleRedundantRow) {
    return "Redundant row";
  } else if (rule_type == kPresolveRuleEmptyCol) {
    return "Empty column";
  } else if (rule_type == kPresolveRuleFixedCol) {
    return "Fixed column";
  } else if (rule_type == kPresolveRuleDominatedCol) {
    return "Dominated col";
  } else if (rule_type == kPresolveRuleForcingRow) {
    return "Forcing row";
  } else if (rule_type == kPresolveRuleForcingCol) {
    return "Forcing col";
  } else if (rule_type == kPresolveRuleFreeColSubstitution) {
    return "Free col substitution";
  } else if (rule_type == kPresolveRuleDoubletonEquation) {
    return "Doubleton equation";
  } else if (rule_type == kPresolveRuleDependentEquations) {
    return "Dependent equations";
  } else if (rule_type == kPresolveRuleDependentFreeCols) {
    return "Dependent free columns";
  } else if (rule_type == kPresolveRuleAggregator) {
    return "Aggregator";
  } else if (rule_type == kPresolveRuleParallelRowsAndCols) {
    return "Parallel rows and columns";
  }
  assert(1 == 0);
  return "????";
}